

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

void __thiscall cs::token_id::~token_id(token_id *this)

{
  token_id *in_RDI;
  
  ~token_id(in_RDI);
  token_base::operator_delete((void *)0x58b3e2);
  return;
}

Assistant:

token_id() = delete;